

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::LoadMD5AnimFile(MD5Importer *this)

{
  float fVar1;
  uint uVar2;
  IOSystem *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  IOStream *__p;
  pointer pIVar7;
  undefined4 extraout_var;
  Logger *pLVar8;
  size_type sVar9;
  size_type sVar10;
  aiAnimation **ppaVar11;
  aiAnimation *this_01;
  aiNodeAnim **ppaVar12;
  aiNodeAnim *paVar13;
  reference rOther;
  ulong uVar14;
  aiVectorKey *paVar15;
  aiQuatKey *paVar16;
  reference pFVar17;
  reference pAVar18;
  DeadlyImportError *this_02;
  float *pfVar19;
  double *pdVar20;
  aiNode *this_03;
  bool local_6f1;
  aiQuatKey *local_6e0;
  aiVectorKey *local_6b8;
  undefined1 local_640 [8];
  SkeletonMeshBuilder skeleton_maker;
  uint local_5e8;
  uint i_2;
  uint i_1;
  aiVector3D vTemp;
  aiQuatKey *qKey;
  aiVectorKey *vKey;
  aiNodeAnim *pcCurAnimBone;
  float *fpCur;
  string local_5b0;
  __normal_iterator<Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
  local_590;
  __normal_iterator<Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
  local_588;
  __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
  local_580;
  const_iterator iter2;
  BaseFrameDesc *pcBaseFrame;
  aiNodeAnim **local_568;
  aiNodeAnim **pcAnimNode;
  double dTime;
  __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
  local_550;
  const_iterator iterEnd;
  __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
  local_540;
  const_iterator iter;
  aiNodeAnim *node;
  uint i;
  aiAnimation *anim;
  MD5AnimParser animParser;
  MD5Parser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_38;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  string pFile;
  MD5Importer *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &this->mFile,"md5anim");
  this_00 = this->pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rb",&local_59);
  __p = IOSystem::Open(this_00,(string *)&file,&local_58);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_38,__p);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_38)
  ;
  if (pIVar7 != (pointer)0x0) {
    pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_38);
    iVar6 = (*pIVar7->_vptr_IOStream[6])();
    if (CONCAT44(extraout_var,iVar6) != 0) {
      pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                         (&local_38);
      LoadFileIntoMemory(this,pIVar7);
      MD5::MD5Parser::MD5Parser
                ((MD5Parser *)&animParser.mNumAnimatedComponents,this->mBuffer,this->fileSize);
      MD5::MD5AnimParser::MD5AnimParser
                ((MD5AnimParser *)&anim,(SectionList *)&animParser.mNumAnimatedComponents);
      bVar5 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              empty((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_> *
                    )&animParser);
      if ((bVar5) ||
         (bVar5 = std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
                  empty((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_> *)
                        &animParser.mBaseFrames.
                         super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar5)) {
LAB_0070052e:
        pLVar8 = DefaultLogger::get();
        Logger::error(pLVar8,"MD5ANIM: No frames or animated bones loaded");
      }
      else {
        sVar9 = std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ::size((vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                        *)&animParser.mAnimatedBones.
                           super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar10 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ::size((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                         *)&animParser);
        if (sVar9 != sVar10) goto LAB_0070052e;
        this->bHadMD5Anim = true;
        this->pScene->mNumAnimations = 1;
        ppaVar11 = (aiAnimation **)operator_new__(8);
        this->pScene->mAnimations = ppaVar11;
        this_01 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_01);
        *this->pScene->mAnimations = this_01;
        sVar9 = std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                size((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      *)&animParser);
        this_01->mNumChannels = (uint)sVar9;
        ppaVar12 = (aiNodeAnim **)operator_new__((ulong)this_01->mNumChannels << 3);
        this_01->mChannels = ppaVar12;
        for (node._4_4_ = 0; node._4_4_ < this_01->mNumChannels; node._4_4_ = node._4_4_ + 1) {
          paVar13 = (aiNodeAnim *)operator_new(0x438);
          aiNodeAnim::aiNodeAnim(paVar13);
          this_01->mChannels[node._4_4_] = paVar13;
          rOther = std::
                   vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                   operator[]((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                               *)&animParser,(ulong)node._4_4_);
          aiString::aiString((aiString *)((long)&iter._M_current + 4),(aiString *)rOther);
          aiString::operator=((aiString *)paVar13,(aiString *)((long)&iter._M_current + 4));
          sVar9 = std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::size
                            ((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                              *)&animParser.mBaseFrames.
                                 super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = sVar9;
          uVar14 = SUB168(auVar3 * ZEXT816(0x18),0);
          if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          paVar15 = (aiVectorKey *)operator_new__(uVar14);
          if (sVar9 != 0) {
            local_6b8 = paVar15;
            do {
              aiVectorKey::aiVectorKey(local_6b8);
              local_6b8 = local_6b8 + 1;
            } while (local_6b8 != paVar15 + sVar9);
          }
          paVar13->mPositionKeys = paVar15;
          sVar9 = std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::size
                            ((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                              *)&animParser.mBaseFrames.
                                 super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = sVar9;
          uVar14 = SUB168(auVar4 * ZEXT816(0x18),0);
          if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          paVar16 = (aiQuatKey *)operator_new__(uVar14);
          if (sVar9 != 0) {
            local_6e0 = paVar16;
            do {
              aiQuatKey::aiQuatKey(local_6e0);
              local_6e0 = local_6e0 + 1;
            } while (local_6e0 != paVar16 + sVar9);
          }
          paVar13->mRotationKeys = paVar16;
        }
        this_01->mTicksPerSecond = (double)anim._0_4_;
        iterEnd._M_current =
             (FrameDesc *)
             std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::begin
                       ((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_> *)
                        &animParser.mBaseFrames.
                         super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<Assimp::MD5::FrameDesc_const*,std::vector<Assimp::MD5::FrameDesc,std::allocator<Assimp::MD5::FrameDesc>>>
        ::__normal_iterator<Assimp::MD5::FrameDesc*>
                  ((__normal_iterator<Assimp::MD5::FrameDesc_const*,std::vector<Assimp::MD5::FrameDesc,std::allocator<Assimp::MD5::FrameDesc>>>
                    *)&local_540,
                   (__normal_iterator<Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                    *)&iterEnd);
        dTime = (double)std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                        ::end((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                               *)&animParser.mBaseFrames.
                                  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<Assimp::MD5::FrameDesc_const*,std::vector<Assimp::MD5::FrameDesc,std::allocator<Assimp::MD5::FrameDesc>>>
        ::__normal_iterator<Assimp::MD5::FrameDesc*>
                  ((__normal_iterator<Assimp::MD5::FrameDesc_const*,std::vector<Assimp::MD5::FrameDesc,std::allocator<Assimp::MD5::FrameDesc>>>
                    *)&local_550,
                   (__normal_iterator<Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                    *)&dTime);
        while (bVar5 = __gnu_cxx::operator!=(&local_540,&local_550), bVar5) {
          pFVar17 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                    ::operator*(&local_540);
          pcAnimNode = (aiNodeAnim **)(double)pFVar17->iIndex;
          local_568 = this_01->mChannels;
          pFVar17 = __gnu_cxx::
                    __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                    ::operator*(&local_540);
          bVar5 = std::vector<float,_std::allocator<float>_>::empty(&pFVar17->mValues);
          local_6f1 = true;
          if (bVar5) {
            pcBaseFrame = (BaseFrameDesc *)
                          std::
                          vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
                          begin((vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                                 *)&animParser.mBaseFrames.
                                    super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_6f1 = __gnu_cxx::operator==
                                  (&local_540,
                                   (__normal_iterator<Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                                    *)&pcBaseFrame);
          }
          if (local_6f1 != false) {
            iter2._M_current =
                 (AnimBoneDesc *)
                 std::
                 vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::
                 operator[]((vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                             *)&animParser.mAnimatedBones.
                                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
            local_588._M_current =
                 (AnimBoneDesc *)
                 std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ::begin((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                          *)&animParser);
            __gnu_cxx::
            __normal_iterator<Assimp::MD5::AnimBoneDesc_const*,std::vector<Assimp::MD5::AnimBoneDesc,std::allocator<Assimp::MD5::AnimBoneDesc>>>
            ::__normal_iterator<Assimp::MD5::AnimBoneDesc*>
                      ((__normal_iterator<Assimp::MD5::AnimBoneDesc_const*,std::vector<Assimp::MD5::AnimBoneDesc,std::allocator<Assimp::MD5::AnimBoneDesc>>>
                        *)&local_580,&local_588);
            while( true ) {
              local_590._M_current =
                   (AnimBoneDesc *)
                   std::
                   vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                   end((vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                        *)&animParser);
              bVar5 = __gnu_cxx::operator!=(&local_580,&local_590);
              if (!bVar5) break;
              pAVar18 = __gnu_cxx::
                        __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
                        ::operator*(&local_580);
              uVar2 = pAVar18->iFirstKeyIndex;
              pFVar17 = __gnu_cxx::
                        __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                        ::operator*(&local_540);
              sVar9 = std::vector<float,_std::allocator<float>_>::size(&pFVar17->mValues);
              if (uVar2 < sVar9) {
                pFVar17 = __gnu_cxx::
                          __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
                          ::operator*(&local_540);
                pAVar18 = __gnu_cxx::
                          __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
                          ::operator*(&local_580);
                pcCurAnimBone =
                     (aiNodeAnim *)
                     std::vector<float,_std::allocator<float>_>::operator[]
                               (&pFVar17->mValues,(ulong)pAVar18->iFirstKeyIndex);
                paVar13 = *local_568;
                uVar2 = paVar13->mNumPositionKeys;
                paVar13->mNumPositionKeys = uVar2 + 1;
                paVar15 = paVar13->mPositionKeys + uVar2;
                uVar2 = paVar13->mNumRotationKeys;
                paVar13->mNumRotationKeys = uVar2 + 1;
                vTemp._4_8_ = paVar13->mRotationKeys + uVar2;
                aiVector3t<float>::aiVector3t((aiVector3t<float> *)&i_2);
                for (local_5e8 = 0; local_5e8 < 3; local_5e8 = local_5e8 + 1) {
                  pAVar18 = __gnu_cxx::
                            __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
                            ::operator*(&local_580);
                  if ((pAVar18->iFlags & 1 << ((byte)local_5e8 & 0x1f)) == 0) {
                    pfVar19 = aiVector3t<float>::operator[]
                                        ((aiVector3t<float> *)iter2._M_current,local_5e8);
                    fVar1 = *pfVar19;
                    pfVar19 = aiVector3t<float>::operator[](&paVar15->mValue,local_5e8);
                    *pfVar19 = fVar1;
                  }
                  else {
                    fVar1 = (float)(pcCurAnimBone->mNodeName).length;
                    pfVar19 = aiVector3t<float>::operator[](&paVar15->mValue,local_5e8);
                    *pfVar19 = fVar1;
                    pcCurAnimBone = (aiNodeAnim *)(pcCurAnimBone->mNodeName).data;
                  }
                }
                for (skeleton_maker._76_4_ = 0; (uint)skeleton_maker._76_4_ < 3;
                    skeleton_maker._76_4_ = skeleton_maker._76_4_ + 1) {
                  pAVar18 = __gnu_cxx::
                            __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
                            ::operator*(&local_580);
                  if ((pAVar18->iFlags & 8 << (skeleton_maker._76_1_ & 0x1f)) == 0) {
                    pfVar19 = aiVector3t<float>::operator[]
                                        ((aiVector3t<float> *)
                                         (((iter2._M_current)->super_BaseJointDescription).mName.
                                          data + 8),skeleton_maker._76_4_);
                    fVar1 = *pfVar19;
                    pfVar19 = aiVector3t<float>::operator[]
                                        ((aiVector3t<float> *)&i_2,skeleton_maker._76_4_);
                    *pfVar19 = fVar1;
                  }
                  else {
                    fVar1 = (float)(pcCurAnimBone->mNodeName).length;
                    pfVar19 = aiVector3t<float>::operator[]
                                        ((aiVector3t<float> *)&i_2,skeleton_maker._76_4_);
                    *pfVar19 = fVar1;
                    pcCurAnimBone = (aiNodeAnim *)(pcCurAnimBone->mNodeName).data;
                  }
                }
                MD5::ConvertQuaternion((aiVector3D *)&i_2,(aiQuaternion *)(vTemp._4_8_ + 8));
                paVar15->mTime = (double)pcAnimNode;
                *(aiNodeAnim ***)vTemp._4_8_ = pcAnimNode;
              }
              else {
                pAVar18 = __gnu_cxx::
                          __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
                          ::operator*(&local_580);
                if (pAVar18->iFlags != 0) {
                  fpCur._6_1_ = 1;
                  this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_5b0,"MD5: Keyframe index is out of range",
                             (allocator<char> *)((long)&fpCur + 7));
                  DeadlyImportError::DeadlyImportError(this_02,&local_5b0);
                  fpCur._6_1_ = 0;
                  __cxa_throw(this_02,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::AnimBoneDesc_*,_std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>_>
              ::operator++(&local_580);
              local_568 = local_568 + 1;
              iter2._M_current =
                   (AnimBoneDesc *)
                   (((iter2._M_current)->super_BaseJointDescription).mName.data + 0x14);
            }
          }
          pdVar20 = std::max<double>((double *)&pcAnimNode,&this_01->mDuration);
          this_01->mDuration = *pdVar20;
          __gnu_cxx::
          __normal_iterator<const_Assimp::MD5::FrameDesc_*,_std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>_>
          ::operator++(&local_540);
        }
        if (this->pScene->mRootNode == (aiNode *)0x0) {
          this_03 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_03);
          this->pScene->mRootNode = this_03;
          aiString::Set(&this->pScene->mRootNode->mName,"<MD5_Hierarchy>");
          AttachChilds_Anim(this,-1,this->pScene->mRootNode,(AnimBoneList *)&animParser,
                            this_01->mChannels);
          if (this->pScene->mRootNode->mNumChildren != 0) {
            SkeletonMeshBuilder::SkeletonMeshBuilder
                      ((SkeletonMeshBuilder *)local_640,this->pScene,
                       *this->pScene->mRootNode->mChildren,false);
            SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_640);
          }
        }
      }
      MD5::MD5AnimParser::~MD5AnimParser((MD5AnimParser *)&anim);
      MD5::MD5Parser::~MD5Parser((MD5Parser *)&animParser.mNumAnimatedComponents);
      goto LAB_00701008;
    }
  }
  pLVar8 = DefaultLogger::get();
  std::operator+(&local_90,"Failed to read MD5ANIM file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
  Logger::warn(pLVar8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
LAB_00701008:
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_38);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void MD5Importer::LoadMD5AnimFile ()
{
    std::string pFile = mFile + "md5anim";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        ASSIMP_LOG_WARN("Failed to read MD5ANIM file: " + pFile);
        return;
    }
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the animation information from the parse tree
    MD5::MD5AnimParser animParser(parser.mSections);

    // generate and fill the output animation
    if (animParser.mAnimatedBones.empty() || animParser.mFrames.empty() ||
        animParser.mBaseFrames.size() != animParser.mAnimatedBones.size())  {
        ASSIMP_LOG_ERROR("MD5ANIM: No frames or animated bones loaded");
    }
    else {
        bHadMD5Anim = true;

        pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations = 1];
        aiAnimation* anim = pScene->mAnimations[0] = new aiAnimation();
        anim->mNumChannels = (unsigned int)animParser.mAnimatedBones.size();
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
        for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
            aiNodeAnim* node = anim->mChannels[i] = new aiNodeAnim();
            node->mNodeName = aiString( animParser.mAnimatedBones[i].mName );

            // allocate storage for the keyframes
            node->mPositionKeys = new aiVectorKey[animParser.mFrames.size()];
            node->mRotationKeys = new aiQuatKey[animParser.mFrames.size()];
        }

        // 1 tick == 1 frame
        anim->mTicksPerSecond = animParser.fFrameRate;

        for (FrameList::const_iterator iter = animParser.mFrames.begin(), iterEnd = animParser.mFrames.end();iter != iterEnd;++iter){
            double dTime = (double)(*iter).iIndex;
            aiNodeAnim** pcAnimNode = anim->mChannels;
            if (!(*iter).mValues.empty() || iter == animParser.mFrames.begin()) /* be sure we have at least one frame */
            {
                // now process all values in there ... read all joints
                MD5::BaseFrameDesc* pcBaseFrame = &animParser.mBaseFrames[0];
                for (AnimBoneList::const_iterator iter2 = animParser.mAnimatedBones.begin(); iter2 != animParser.mAnimatedBones.end();++iter2,
                    ++pcAnimNode,++pcBaseFrame)
                {
                    if((*iter2).iFirstKeyIndex >= (*iter).mValues.size()) {

                        // Allow for empty frames
                        if ((*iter2).iFlags != 0) {
                            throw DeadlyImportError("MD5: Keyframe index is out of range");

                        }
                        continue;
                    }
                    const float* fpCur = &(*iter).mValues[(*iter2).iFirstKeyIndex];
                    aiNodeAnim* pcCurAnimBone = *pcAnimNode;

                    aiVectorKey* vKey = &pcCurAnimBone->mPositionKeys[pcCurAnimBone->mNumPositionKeys++];
                    aiQuatKey* qKey = &pcCurAnimBone->mRotationKeys  [pcCurAnimBone->mNumRotationKeys++];
                    aiVector3D vTemp;

                    // translational component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (1u << i)) {
                            vKey->mValue[i] =  *fpCur++;
                        }
                        else vKey->mValue[i] = pcBaseFrame->vPositionXYZ[i];
                    }

                    // orientation component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (8u << i)) {
                            vTemp[i] =  *fpCur++;
                        }
                        else vTemp[i] = pcBaseFrame->vRotationQuat[i];
                    }

                    MD5::ConvertQuaternion(vTemp, qKey->mValue);
                    qKey->mTime = vKey->mTime = dTime;
                }
            }

            // compute the duration of the animation
            anim->mDuration = std::max(dTime,anim->mDuration);
        }

        // If we didn't build the hierarchy yet (== we didn't load a MD5MESH),
        // construct it now from the data given in the MD5ANIM.
        if (!pScene->mRootNode) {
            pScene->mRootNode = new aiNode();
            pScene->mRootNode->mName.Set("<MD5_Hierarchy>");

            AttachChilds_Anim(-1,pScene->mRootNode,animParser.mAnimatedBones,(const aiNodeAnim**)anim->mChannels);

            // Call SkeletonMeshBuilder to construct a mesh to represent the shape
            if (pScene->mRootNode->mNumChildren) {
                SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[0]);
            }
        }
    }
}